

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

char * cmTargetPropertyComputer::GetSources<cmTarget>
                 (cmTarget *tgt,cmMessenger *messenger,cmListFileBacktrace *context)

{
  cmTargetInternals *pcVar1;
  char *__s1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  PolicyStatus PVar6;
  size_type sVar7;
  size_t sVar8;
  cmSourceFile *this;
  cmSourceFileLocation *pcVar9;
  ostream *poVar10;
  PolicyID id;
  _Alloc_hider _Var11;
  pointer pbVar12;
  char *__s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string objLibName;
  ostringstream e;
  ostringstream ss;
  undefined1 local_3a8 [32];
  cmListFileBacktrace *local_388;
  cmTarget *local_380;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_378;
  cmMessenger *local_358;
  pointer local_350;
  string *local_348;
  string local_340;
  _Base_ptr *local_320;
  long local_318;
  _Base_ptr local_310 [12];
  ios_base local_2b0 [264];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  pcVar1 = (tgt->Internal).Pointer;
  pbVar12 = (pcVar1->SourceEntries).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_350 = (pcVar1->SourceEntries).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_350 == pbVar12) {
    _Var11._M_p = (pointer)0x0;
  }
  else {
    local_388 = context;
    local_380 = tgt;
    local_358 = messenger;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    __s = "";
    do {
      local_378.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
      local_378.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
      local_378.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_348 = pbVar12;
      cmSystemTools::ExpandListArgument(pbVar12,&local_378,false);
      for (pbVar12 = local_378.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pbVar12 !=
          local_378.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; pbVar12 = pbVar12 + 1) {
        __s1 = (pbVar12->_M_dataplus)._M_p;
        iVar5 = strncmp(__s1,"$<TARGET_OBJECTS:",0x11);
        if ((iVar5 == 0) && (__s1[pbVar12->_M_string_length - 1] == '>')) {
          std::__cxx11::string::substr((ulong)&local_340,(ulong)pbVar12);
          sVar7 = cmGeneratorExpression::Find(&local_340);
          if (sVar7 == 0xffffffffffffffff) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_320);
            local_3a8._16_8_ = (local_388->Bottom).Position.Position;
            local_3a8._0_8_ = (local_388->Bottom).State;
            local_3a8._8_8_ = (local_388->Bottom).Position.Tree;
            PVar6 = cmStateSnapshot::GetPolicy((cmStateSnapshot *)local_3a8,CMP0051);
            if (PVar6 - NEW < 3) {
              bVar4 = true;
              bVar3 = true;
            }
            else if (PVar6 == WARN) {
              cmPolicies::GetPolicyWarning_abi_cxx11_((string *)local_3a8,(cmPolicies *)0x33,id);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_320,(char *)local_3a8._0_8_,local_3a8._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
              if ((cmState *)local_3a8._0_8_ != (cmState *)(local_3a8 + 0x10)) {
                operator_delete((void *)local_3a8._0_8_,local_3a8._16_8_ + 1);
              }
              bVar4 = false;
              bVar3 = false;
            }
            else {
              bVar3 = true;
              bVar4 = false;
            }
            if (!bVar3) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_320,"Target \"",8);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_320,(local_380->Name)._M_dataplus._M_p,
                                   (local_380->Name)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,
                         "\" contains $<TARGET_OBJECTS> generator expression in its sources list.  This content was not previously part of the SOURCES property when that property was read at configure time.  Code reading that property needs to be adapted to ignore the generator expression using the string(GENEX_STRIP) command."
                         ,0x12d);
              std::__cxx11::stringbuf::str();
              cmMessenger::IssueMessage(local_358,AUTHOR_WARNING,(string *)local_3a8,local_388);
              if ((cmState *)local_3a8._0_8_ != (cmState *)(local_3a8 + 0x10)) {
                operator_delete((void *)local_3a8._0_8_,local_3a8._16_8_ + 1);
              }
            }
            if (bVar4) {
              if (__s == (char *)0x0) {
                std::ios::clear((int)local_3a8 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x200)
                ;
              }
              else {
                sVar8 = strlen(__s);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar8);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(pbVar12->_M_dataplus)._M_p,pbVar12->_M_string_length)
              ;
              __s = ";";
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_320);
            std::ios_base::~ios_base(local_2b0);
          }
          else {
            if (__s == (char *)0x0) {
              std::ios::clear((int)local_3a8 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x200);
            }
            else {
              sVar8 = strlen(__s);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar8);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,(pbVar12->_M_dataplus)._M_p,pbVar12->_M_string_length);
            __s = ";";
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_340._M_dataplus._M_p != &local_340.field_2) {
            operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          sVar7 = cmGeneratorExpression::Find(pbVar12);
          if (sVar7 == 0xffffffffffffffff) {
            if (__s == (char *)0x0) {
              std::ios::clear((int)local_3a8 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x200);
            }
            else {
              sVar8 = strlen(__s);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar8);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,(pbVar12->_M_dataplus)._M_p,pbVar12->_M_string_length);
            __s = ";";
          }
          else {
            this = cmMakefile::GetOrCreateSource(local_380->Makefile,pbVar12,false);
            pcVar9 = cmSourceFile::GetLocation(this);
            local_320 = local_310;
            pcVar2 = (pcVar9->Directory)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_320,pcVar2,pcVar2 + (pcVar9->Directory)._M_string_length);
            if (local_318 != 0) {
              std::__cxx11::string::append((char *)&local_320);
            }
            std::__cxx11::string::_M_append
                      ((char *)&local_320,(ulong)(pcVar9->Name)._M_dataplus._M_p);
            if (__s == (char *)0x0) {
              std::ios::clear((int)local_3a8 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x200);
            }
            else {
              sVar8 = strlen(__s);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar8);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,(char *)local_320,local_318);
            if (local_320 != local_310) {
              operator_delete(local_320,(ulong)((long)&local_310[0]->_M_color + 1));
            }
            __s = ";";
          }
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_378);
      pbVar12 = local_348 + 1;
    } while (pbVar12 != local_350);
    if (GetSources<cmTarget>(cmTarget_const*,cmMessenger*,cmListFileBacktrace_const&)::
        srcs_abi_cxx11_ == '\0') {
      GetSources<cmTarget>();
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=
              ((string *)
               &GetSources<cmTarget>(cmTarget_const*,cmMessenger*,cmListFileBacktrace_const&)::
                srcs_abi_cxx11_,(string *)&local_320);
    if (local_320 != local_310) {
      operator_delete(local_320,(ulong)((long)&local_310[0]->_M_color + 1));
    }
    _Var11._M_p = GetSources<cmTarget>(cmTarget_const*,cmMessenger*,cmListFileBacktrace_const&)::
                  srcs_abi_cxx11_._M_dataplus._M_p;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  return _Var11._M_p;
}

Assistant:

const char* cmTargetPropertyComputer::GetSources<cmTarget>(
  cmTarget const* tgt, cmMessenger* messenger,
  cmListFileBacktrace const& context)
{
  cmStringRange entries = tgt->GetSourceEntries();
  if (entries.empty()) {
    return CM_NULLPTR;
  }

  std::ostringstream ss;
  const char* sep = "";
  for (std::vector<std::string>::const_iterator i = entries.begin();
       i != entries.end(); ++i) {
    std::string const& entry = *i;

    std::vector<std::string> files;
    cmSystemTools::ExpandListArgument(entry, files);
    for (std::vector<std::string>::const_iterator li = files.begin();
         li != files.end(); ++li) {
      if (cmHasLiteralPrefix(*li, "$<TARGET_OBJECTS:") &&
          (*li)[li->size() - 1] == '>') {
        std::string objLibName = li->substr(17, li->size() - 18);

        if (cmGeneratorExpression::Find(objLibName) != std::string::npos) {
          ss << sep;
          sep = ";";
          ss << *li;
          continue;
        }

        bool addContent = false;
        bool noMessage = true;
        std::ostringstream e;
        cmake::MessageType messageType = cmake::AUTHOR_WARNING;
        switch (context.GetBottom().GetPolicy(cmPolicies::CMP0051)) {
          case cmPolicies::WARN:
            e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0051) << "\n";
            noMessage = false;
          case cmPolicies::OLD:
            break;
          case cmPolicies::REQUIRED_ALWAYS:
          case cmPolicies::REQUIRED_IF_USED:
          case cmPolicies::NEW:
            addContent = true;
        }
        if (!noMessage) {
          e << "Target \"" << tgt->GetName()
            << "\" contains "
               "$<TARGET_OBJECTS> generator expression in its sources "
               "list.  "
               "This content was not previously part of the SOURCES "
               "property "
               "when that property was read at configure time.  Code "
               "reading "
               "that property needs to be adapted to ignore the generator "
               "expression using the string(GENEX_STRIP) command.";
          messenger->IssueMessage(messageType, e.str(), context);
        }
        if (addContent) {
          ss << sep;
          sep = ";";
          ss << *li;
        }
      } else if (cmGeneratorExpression::Find(*li) == std::string::npos) {
        ss << sep;
        sep = ";";
        ss << *li;
      } else {
        cmSourceFile* sf = tgt->GetMakefile()->GetOrCreateSource(*li);
        // Construct what is known about this source file location.
        cmSourceFileLocation const& location = sf->GetLocation();
        std::string sname = location.GetDirectory();
        if (!sname.empty()) {
          sname += "/";
        }
        sname += location.GetName();

        ss << sep;
        sep = ";";
        // Append this list entry.
        ss << sname;
      }
    }
  }
  static std::string srcs;
  srcs = ss.str();
  return srcs.c_str();
}